

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

void finish(svm_params *params)

{
  ostream *poVar1;
  void *pvVar2;
  long in_RDI;
  
  free(*(void **)(in_RDI + 0x48));
  poVar1 = std::operator<<((ostream *)(*(long *)(in_RDI + 0x88) + 0xe0),"Num support = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,**(ulong **)(in_RDI + 0x38));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)(*(long *)(in_RDI + 0x88) + 0xe0),
                           "Number of kernel evaluations = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,num_kernel_evals);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"Number of cache queries = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,num_cache_evals);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)(*(long *)(in_RDI + 0x88) + 0xe0),"Total loss = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(float *)(in_RDI + 0x80));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  free_svm_model((svm_model *)params);
  poVar1 = std::operator<<((ostream *)(*(long *)(in_RDI + 0x88) + 0xe0),"Done freeing model");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if (*(long *)(in_RDI + 0x58) != 0) {
    free(*(void **)(in_RDI + 0x58));
  }
  poVar1 = std::operator<<((ostream *)(*(long *)(in_RDI + 0x88) + 0xe0),"Done freeing kernel params"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)(*(long *)(in_RDI + 0x88) + 0xe0),"Done with finish ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void finish(svm_params& params)
{
  free(params.pool);

  params.all->trace_message << "Num support = " << params.model->num_support << endl;
  params.all->trace_message << "Number of kernel evaluations = " << num_kernel_evals << " "
                            << "Number of cache queries = " << num_cache_evals << endl;
  params.all->trace_message << "Total loss = " << params.loss_sum << endl;

  free_svm_model(params.model);
  params.all->trace_message << "Done freeing model" << endl;
  if (params.kernel_params)
    free(params.kernel_params);
  params.all->trace_message << "Done freeing kernel params" << endl;
  params.all->trace_message << "Done with finish " << endl;
}